

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCheck.c
# Opt level: O2

int cuddHeapProfile(DdManager *dd)

{
  uint uVar1;
  DdSubtable *pDVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint local_48;
  
  uVar1 = dd->size;
  pDVar2 = dd->subtables;
  local_48 = 0;
  iVar3 = fprintf((FILE *)dd->out,"*** DD heap profile for 0x%lx ***\n");
  if (iVar3 != -1) {
    uVar9 = 0;
    uVar11 = 0;
    if (0 < (int)uVar1) {
      uVar11 = (ulong)uVar1;
    }
    puVar7 = &pDVar2->dead;
    uVar10 = 0xffffffffffffffff;
    uVar8 = 0xffffffff;
    uVar6 = 0;
    for (; iVar3 = (int)uVar8, uVar11 != uVar9; uVar9 = uVar9 + 1) {
      uVar5 = puVar7[-2] - *puVar7;
      if (uVar5 != 0) {
        iVar4 = fprintf((FILE *)dd->out,"%5d: %5d nodes\n",uVar9 & 0xffffffff,(ulong)uVar5);
        if (iVar4 == -1) {
          return 0;
        }
        uVar6 = uVar6 + 1;
        if (iVar3 < (int)uVar5) {
          uVar10 = uVar9;
        }
        uVar10 = uVar10 & 0xffffffff;
        if (iVar3 < (int)uVar5) {
          uVar8 = (ulong)uVar5;
        }
      }
      puVar7 = puVar7 + 0xe;
    }
    uVar5 = (dd->constants).keys - (dd->constants).dead;
    if (uVar5 != 0) {
      iVar4 = fprintf((FILE *)dd->out,"const: %5d nodes\n",(ulong)uVar5);
      if (iVar4 == -1) {
        return 0;
      }
      uVar6 = uVar6 + 1;
      uVar10 = uVar10 & 0xffffffff;
      if (iVar3 < (int)uVar5) {
        uVar10 = 0x7fffffff;
        uVar8 = (ulong)uVar5;
      }
    }
    local_48 = 0;
    iVar3 = fprintf((FILE *)dd->out,"Summary: %d tables, %d non-empty, largest: %d ",
                    (ulong)(uVar1 + 1),(ulong)uVar6,uVar10 & 0xffffffff);
    if (iVar3 != -1) {
      iVar3 = fprintf((FILE *)dd->out,"(with %d nodes)\n",uVar8);
      local_48 = (uint)(iVar3 != -1);
    }
  }
  return local_48;
}

Assistant:

int
cuddHeapProfile(
  DdManager * dd)
{
    int ntables = dd->size;
    DdSubtable *subtables = dd->subtables;
    int i,              /* loop index */
        nodes,          /* live nodes in i-th layer */
        retval,         /* return value of fprintf */
        largest = -1,   /* index of the table with most live nodes */
        maxnodes = -1,  /* maximum number of live nodes in a table */
        nonempty = 0;   /* number of tables with live nodes */

    /* Print header. */
#if SIZEOF_VOID_P == 8
    retval = fprintf(dd->out,"*** DD heap profile for 0x%lx ***\n",
                     (ptruint) dd);
#else
    retval = fprintf(dd->out,"*** DD heap profile for 0x%x ***\n",
                     (ptruint) dd);
#endif
    if (retval == EOF) return 0;

    /* Print number of live nodes for each nonempty table. */
    for (i=0; i<ntables; i++) {
        nodes = subtables[i].keys - subtables[i].dead;
        if (nodes) {
            nonempty++;
            retval = fprintf(dd->out,"%5d: %5d nodes\n", i, nodes);
            if (retval == EOF) return 0;
            if (nodes > maxnodes) {
                maxnodes = nodes;
                largest = i;
            }
        }
    }

    nodes = dd->constants.keys - dd->constants.dead;
    if (nodes) {
        nonempty++;
        retval = fprintf(dd->out,"const: %5d nodes\n", nodes);
        if (retval == EOF) return 0;
        if (nodes > maxnodes) {
            maxnodes = nodes;
            largest = CUDD_CONST_INDEX;
        }
    }

    /* Print summary. */
    retval = fprintf(dd->out,"Summary: %d tables, %d non-empty, largest: %d ",
          ntables+1, nonempty, largest);
    if (retval == EOF) return 0;
    retval = fprintf(dd->out,"(with %d nodes)\n", maxnodes);
    if (retval == EOF) return 0;

    return(1);

}